

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# componententity.cpp
# Opt level: O0

bool __thiscall
libcellml::ComponentEntity::replaceComponent
          (ComponentEntity *this,string *name,ComponentPtr *component,bool searchEncapsulated)

{
  ulong uVar1;
  ComponentEntityImpl *pCVar2;
  size_t sVar3;
  element_type *this_00;
  byte local_69;
  shared_ptr<libcellml::Component> local_50;
  ulong local_40;
  size_t i;
  __normal_iterator<const_std::shared_ptr<libcellml::Component>_*,_std::vector<std::shared_ptr<libcellml::Component>,_std::allocator<std::shared_ptr<libcellml::Component>_>_>_>
  local_30;
  byte local_22;
  byte local_21;
  bool status;
  ComponentPtr *pCStack_20;
  bool searchEncapsulated_local;
  ComponentPtr *component_local;
  string *name_local;
  ComponentEntity *this_local;
  
  local_21 = searchEncapsulated;
  pCStack_20 = component;
  component_local = (ComponentPtr *)name;
  name_local = (string *)this;
  pCVar2 = pFunc(this);
  local_30._M_current =
       (shared_ptr<libcellml::Component> *)
       ComponentEntityImpl::findComponent(pCVar2,(string *)component_local);
  pCVar2 = pFunc(this);
  i = (size_t)std::
              vector<std::shared_ptr<libcellml::Component>,_std::allocator<std::shared_ptr<libcellml::Component>_>_>
              ::begin(&pCVar2->mComponents);
  sVar3 = __gnu_cxx::operator-
                    (&local_30,
                     (__normal_iterator<std::shared_ptr<libcellml::Component>_*,_std::vector<std::shared_ptr<libcellml::Component>,_std::allocator<std::shared_ptr<libcellml::Component>_>_>_>
                      *)&i);
  local_22 = replaceComponent(this,sVar3,pCStack_20);
  if (((local_21 & 1) != 0) && (!(bool)local_22)) {
    local_40 = 0;
    while( true ) {
      uVar1 = local_40;
      sVar3 = componentCount(this);
      local_69 = 0;
      if (uVar1 < sVar3) {
        local_69 = local_22 ^ 0xff;
      }
      if ((local_69 & 1) == 0) break;
      ComponentEntity::component((ComponentEntity *)&local_50,(size_t)this);
      this_00 = std::
                __shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)&local_50);
      local_22 = replaceComponent(&this_00->super_ComponentEntity,(string *)component_local,
                                  pCStack_20,(bool)(local_21 & 1));
      std::shared_ptr<libcellml::Component>::~shared_ptr(&local_50);
      local_40 = local_40 + 1;
    }
  }
  return (bool)(local_22 & 1);
}

Assistant:

bool ComponentEntity::replaceComponent(const std::string &name, const ComponentPtr &component, bool searchEncapsulated)
{
    bool status = replaceComponent(size_t(pFunc()->findComponent(name) - pFunc()->mComponents.begin()), component);
    if (searchEncapsulated && !status) {
        for (size_t i = 0; i < componentCount() && !status; ++i) {
            status = ComponentEntity::component(i)->replaceComponent(name, component, searchEncapsulated);
        }
    }

    return status;
}